

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O0

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CCallExpression *expression)

{
  CExpressionList *pCVar1;
  pointer pCVar2;
  vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  *pvVar3;
  size_type sVar4;
  CCallExpression *pCVar5;
  ulong uVar6;
  const_reference this_00;
  pointer argExp;
  reference pvVar7;
  CSeqStatement *this_01;
  CEseqExpression *this_02;
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> local_f0;
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> local_e8;
  undefined1 local_e0 [16];
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_d0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_c8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_c0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_b8;
  undefined1 local_a9;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_a8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_a0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_98;
  int local_8c;
  int i_1;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> rightStatement;
  int i;
  CExpressionList *tempExpressionList;
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  helpStatements;
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> local_50;
  undefined1 local_48 [16];
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_38 [3];
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> local_20;
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> args;
  CCallExpression *expression_local;
  CEseqFloatVisitor *this_local;
  
  args._M_t.
  super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
  .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>,_true,_true>
        )(__uniq_ptr_data<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>,_true,_true>
          )expression;
  pCVar1 = CCallExpression::getArguments(expression);
  (**(pCVar1->super_IExpression).super_INode._vptr_INode)(pCVar1,this);
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  unique_ptr(&local_20,&this->childExpressionList);
  pCVar2 = std::
           unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
           ::operator->(&local_20);
  pvVar3 = CExpressionList::getExpressions(pCVar2);
  sVar4 = std::
          vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
          ::size(pvVar3);
  if (sVar4 == 0) {
    pCVar5 = (CCallExpression *)operator_new(0x18);
    helpStatements.
    super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    CCallExpression::getFunction
              ((CCallExpression *)
               args._M_t.
               super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
               .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl);
    CNameExpression::CopyCast((CNameExpression *)local_48);
    std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
    unique_ptr((unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                *)(local_48 + 8),
               (unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                *)local_48);
    std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
    unique_ptr(&local_50,&local_20);
    CCallExpression::CCallExpression
              (pCVar5,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                       *)(local_48 + 8),&local_50);
    helpStatements.
    super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               local_38,(pointer)pCVar5);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
              (&this->childExpression,local_38);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(local_38);
    std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
    ~unique_ptr(&local_50);
    std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
    ~unique_ptr((unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                 *)(local_48 + 8));
    std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
    ~unique_ptr((unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                 *)local_48);
    helpStatements.
    super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    std::
    vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ::vector((vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
              *)&tempExpressionList);
    pCVar1 = (CExpressionList *)operator_new(0x20);
    CExpressionList::CExpressionList(pCVar1,(CExpression *)0x0);
    rightStatement._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._4_4_ = 0;
    while( true ) {
      uVar6 = (ulong)rightStatement._M_t.
                     super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                     .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._4_4_;
      pCVar2 = std::
               unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
               ::operator->(&local_20);
      pvVar3 = CExpressionList::getExpressions(pCVar2);
      sVar4 = std::
              vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
              ::size(pvVar3);
      if (sVar4 <= uVar6) break;
      pCVar2 = std::
               unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
               ::operator->(&local_20);
      pvVar3 = CExpressionList::getExpressions(pCVar2);
      this_00 = std::
                vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                ::operator[](pvVar3,(long)rightStatement._M_t.
                                          super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                                          .super__Head_base<0UL,_const_IRT::CStatement_*,_false>.
                                          _M_head_impl._4_4_);
      argExp = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
               ::get(this_00);
      processCallArgument(this,argExp,pCVar1,
                          (vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                           *)&tempExpressionList);
      rightStatement._M_t.
      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t
      .super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
      super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._4_4_ =
           rightStatement._M_t.
           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
           .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._4_4_ + 1;
    }
    pvVar7 = std::
             vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
             ::back((vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                     *)&tempExpressionList);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &stack0xffffffffffffff78,pvVar7);
    std::
    vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ::pop_back((vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                *)&tempExpressionList);
    local_8c = 0;
    while( true ) {
      uVar6 = (ulong)local_8c;
      sVar4 = std::
              vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
              ::size((vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                      *)&tempExpressionList);
      if (sVar4 <= uVar6) break;
      this_01 = (CSeqStatement *)operator_new(0x18);
      local_a9 = 1;
      pvVar7 = std::
               vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
               ::operator[]((vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                             *)&tempExpressionList,(long)local_8c);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_a0,pvVar7);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_a8,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &stack0xffffffffffffff78);
      CSeqStatement::CSeqStatement(this_01,&local_a0,&local_a8);
      local_a9 = 0;
      std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
      unique_ptr<std::default_delete<IRT::CStatement_const>,void>
                ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
                 &local_98,(pointer)this_01);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
                ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &stack0xffffffffffffff78,&local_98);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_98);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_a8);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_a0);
      local_8c = local_8c + 1;
    }
    this_02 = (CEseqExpression *)operator_new(0x18);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_c0,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &stack0xffffffffffffff78);
    pCVar5 = (CCallExpression *)operator_new(0x18);
    CCallExpression::getFunction
              ((CCallExpression *)
               args._M_t.
               super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
               .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl);
    CNameExpression::CopyCast((CNameExpression *)local_e0);
    std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
    unique_ptr((unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                *)(local_e0 + 8),
               (unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                *)local_e0);
    std::unique_ptr<IRT::CExpressionList_const,std::default_delete<IRT::CExpressionList_const>>::
    unique_ptr<std::default_delete<IRT::CExpressionList_const>,void>
              ((unique_ptr<IRT::CExpressionList_const,std::default_delete<IRT::CExpressionList_const>>
                *)&local_f0,pCVar1);
    std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
    unique_ptr(&local_e8,&local_f0);
    CCallExpression::CCallExpression
              (pCVar5,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                       *)(local_e0 + 8),&local_e8);
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_d0,(pointer)pCVar5);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_c8,&local_d0);
    CEseqExpression::CEseqExpression(this_02,&local_c0,&local_c8);
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_b8,(pointer)this_02);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
              (&this->childExpression,&local_b8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_b8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_c8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_d0);
    std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
    ~unique_ptr(&local_e8);
    std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
    ~unique_ptr(&local_f0);
    std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
    ~unique_ptr((unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                 *)(local_e0 + 8));
    std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
    ~unique_ptr((unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                 *)local_e0);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_c0);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &stack0xffffffffffffff78);
    std::
    vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ::~vector((vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
               *)&tempExpressionList);
    helpStatements.
    super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  }
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  ~unique_ptr(&local_20);
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CCallExpression &expression) {
    expression.getArguments()->Accept(*this);
    std::unique_ptr<const CExpressionList> args = std::move(childExpressionList);

    if (args->getExpressions().size() == 0) {
        childExpression = EMOVE_UNIQ(new CCallExpression(
                std::move(expression.getFunction()->CopyCast()),
                std::move(args)
        ));

        return;
    }

    std::vector<std::unique_ptr<const CStatement>> helpStatements;

    CExpressionList* tempExpressionList = new CExpressionList();

    for (int i = 0; i < args->getExpressions().size(); ++i) {
        processCallArgument(args->getExpressions()[i].get(), tempExpressionList, helpStatements);
    }

    std::unique_ptr<const CStatement> rightStatement = std::move(helpStatements.back());
    helpStatements.pop_back();
    for (int i = 0; i < helpStatements.size(); ++i) {
        rightStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(helpStatements[i]),
                std::move(rightStatement)
        ));
    }

    childExpression = EMOVE_UNIQ(new CEseqExpression(
            std::move(rightStatement),
            EMOVE_UNIQ(new CCallExpression(
                    std::move(expression.getFunction()->CopyCast()),
                    std::move(std::unique_ptr<const CExpressionList>(tempExpressionList))
            ))
    ));
}